

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.cxx
# Opt level: O0

bool operator<(cmLinkItem *l,cmLinkItem *r)

{
  cmLinkItem *r_local;
  cmLinkItem *l_local;
  
  if ((l->Target == (cmGeneratorTarget *)0x0) || (r->Target == (cmGeneratorTarget *)0x0)) {
    if (l->Target == (cmGeneratorTarget *)0x0) {
      if (r->Target == (cmGeneratorTarget *)0x0) {
        l_local._7_1_ = std::operator<(&l->String,&r->String);
      }
      else {
        l_local._7_1_ = false;
      }
    }
    else {
      l_local._7_1_ = true;
    }
  }
  else {
    l_local._7_1_ = l->Target < r->Target;
  }
  return l_local._7_1_;
}

Assistant:

bool operator<(cmLinkItem const& l, cmLinkItem const& r)
{
  // Order among targets.
  if (l.Target && r.Target) {
    return l.Target < r.Target;
  }
  // Order targets before strings.
  if (l.Target) {
    return true;
  }
  if (r.Target) {
    return false;
  }
  // Order among strings.
  return l.String < r.String;
}